

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsubdiv.cpp
# Opt level: O0

Point3f pbrt::weightBoundary(SDVertex *vert,Float beta)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint in_XMM0_Da;
  undefined8 uVar4;
  float s;
  Point3<float> PVar5;
  Tuple3<pbrt::Point3,_float> TVar6;
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
  pRing;
  int valence;
  Point3f p;
  size_type in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  SDVertex *in_stack_fffffffffffffe18;
  polymorphic_allocator<pbrt::Point3<float>_> *in_stack_fffffffffffffe20;
  Tuple3<pbrt::Point3,_float> *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  float in_stack_fffffffffffffe34;
  Tuple3<pbrt::Point3,_float> local_158;
  Tuple3<pbrt::Point3,_float> local_148;
  Tuple3<pbrt::Point3,_float> local_138;
  undefined8 local_128;
  float local_120;
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
  local_100;
  int local_20;
  uint local_1c;
  undefined8 local_10;
  float local_8;
  
  local_1c = in_XMM0_Da;
  local_20 = SDVertex::valence(in_stack_fffffffffffffe18);
  pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>::polymorphic_allocator
            ((polymorphic_allocator<pbrt::Point3<float>_> *)
             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>::
  InlinedVector((InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
                 *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                (size_t)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>::
  data(&local_100);
  SDVertex::oneRing((SDVertex *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                    (Point3f *)in_stack_fffffffffffffe28);
  auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416(local_1c),
                           SUB6416(ZEXT464(0x3f800000),0));
  uVar4 = auVar1._8_8_;
  PVar5 = operator*(in_stack_fffffffffffffe34,in_stack_fffffffffffffe28);
  local_120 = PVar5.super_Tuple3<pbrt::Point3,_float>.z;
  auVar3._8_8_ = uVar4;
  auVar3._0_8_ = PVar5.super_Tuple3<pbrt::Point3,_float>._0_8_;
  local_128 = vmovlpd_avx(auVar3);
  local_10 = local_128;
  local_8 = local_120;
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>::
  operator[]((InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
              *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
             in_stack_fffffffffffffe08);
  uVar4 = 0;
  PVar5 = operator*(in_stack_fffffffffffffe34,in_stack_fffffffffffffe28);
  s = PVar5.super_Tuple3<pbrt::Point3,_float>.z;
  auVar2._8_8_ = uVar4;
  auVar2._0_8_ = PVar5.super_Tuple3<pbrt::Point3,_float>._0_8_;
  local_148._0_8_ = vmovlpd_avx(auVar2);
  local_148.z = s;
  local_138._0_8_ = local_148._0_8_;
  local_138.z = s;
  Tuple3<pbrt::Point3,float>::operator+=
            ((Tuple3<pbrt::Point3,float> *)&local_10,(Point3<float> *)&local_138);
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>::
  operator[]((InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
              *)CONCAT44(in_stack_fffffffffffffe14,local_1c),in_stack_fffffffffffffe08);
  uVar4 = 0;
  TVar6 = (Tuple3<pbrt::Point3,_float>)operator*(s,in_stack_fffffffffffffe28);
  local_158.z = TVar6.z;
  auVar1._8_8_ = uVar4;
  auVar1._0_8_ = TVar6._0_8_;
  local_158._0_8_ = vmovlpd_avx(auVar1);
  Tuple3<pbrt::Point3,float>::operator+=
            ((Tuple3<pbrt::Point3,float> *)&local_10,(Point3<float> *)&local_158);
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>::
  ~InlinedVector((InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
                  *)CONCAT44(TVar6.z,local_1c));
  TVar6.z = local_8;
  TVar6.x = (float)(undefined4)local_10;
  TVar6.y = (float)local_10._4_4_;
  return (Point3f)TVar6;
}

Assistant:

static Point3f weightBoundary(SDVertex *vert, Float beta) {
    // Put _vert_ one-ring in _pRing_
    int valence = vert->valence();
    InlinedVector<Point3f, 16> pRing(valence);

    vert->oneRing(pRing.data());
    Point3f p = (1 - 2 * beta) * vert->p;
    p += beta * pRing[0];
    p += beta * pRing[valence - 1];
    return p;
}